

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O3

void __thiscall Compiler::validateArgumentCount(Compiler *this,uint expected,uint got)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  long *plVar1;
  size_type *psVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string local_80;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (expected == got) {
    return;
  }
  __return_storage_ptr__ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       __cxa_allocate_exception(0x20);
  std::__cxx11::to_string(&local_80,got);
  std::operator+(&local_40,"Malformed argument list, got ",&local_80);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_40);
  local_a0._M_dataplus._M_p = (pointer)*plVar1;
  psVar2 = (size_type *)(plVar1 + 2);
  if ((size_type *)local_a0._M_dataplus._M_p == psVar2) {
    local_a0.field_2._M_allocated_capacity = *psVar2;
    local_a0.field_2._8_8_ = plVar1[3];
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  }
  else {
    local_a0.field_2._M_allocated_capacity = *psVar2;
  }
  local_a0._M_string_length = plVar1[1];
  *plVar1 = (long)psVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::__cxx11::to_string(&local_60,expected);
  std::operator+(__return_storage_ptr__,&local_a0,&local_60);
  __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void Compiler::validateArgumentCount(unsigned int expected, unsigned int got)
{
    if(expected != got)
    {
        throw std::string("Malformed argument list, got " + std::to_string(got) + " when expected " + std::to_string(expected));
    }
}